

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O3

bool __thiscall LPCMStreamReader::beforeFileCloseEvent(LPCMStreamReader *this,File *file)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  uint32_t dataSize;
  int64_t fileSize;
  int local_1c;
  int64_t local_18;
  
  (*(file->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[6])(file);
  local_18 = 0;
  File::size(file,&local_18);
  if (local_18 < 0x100000000) {
    local_1c = (int)local_18 + -8;
    iVar3 = File::seek(file,4,smBegin);
    if (iVar3 != -1) {
      iVar2 = (*(file->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                        (file,&local_1c,4);
      if (iVar2 == 4) {
        iVar3 = File::seek(file,0x40,smBegin);
        if (iVar3 != -1) {
          local_1c = (int)local_18 + -0x44;
          iVar2 = (*(file->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                            (file,&local_1c,4);
          if (iVar2 == 4) goto LAB_00193873;
        }
      }
    }
    bVar1 = false;
  }
  else {
LAB_00193873:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool LPCMStreamReader::beforeFileCloseEvent(File& file)
{
    file.sync();
    int64_t fileSize = 0;
    file.size(&fileSize);
    if (fileSize <= UINT_MAX)
    {
        uint32_t dataSize = static_cast<uint32_t>(fileSize) - 8;
        if (file.seek(4, File::SeekMethod::smBegin) == -1)
            return false;
        if (file.write(&dataSize, 4) != 4)
            return false;
        if (file.seek(64, File::SeekMethod::smBegin) == -1)
            return false;
        dataSize = static_cast<uint32_t>(fileSize) - 68;
        if (file.write(&dataSize, 4) != 4)
            return false;
    }
    return true;
}